

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::GetUIntLength(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  uchar m;
  uchar b;
  int status;
  longlong available;
  longlong total;
  byte local_36;
  byte local_35;
  int local_34;
  long local_30;
  long local_28;
  long *local_20;
  long local_18;
  long *local_10;
  long local_8;
  
  if ((in_RDI == (long *)0x0) || (in_RSI < 0)) {
    local_8 = -2;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_34 = (**(code **)(*in_RDI + 8))(in_RDI,&local_28,&local_30);
    if ((local_34 < 0) || ((-1 < local_28 && (local_28 < local_30)))) {
      local_8 = -2;
    }
    else {
      *local_20 = 1;
      if (local_18 < local_30) {
        iVar1 = (**(code **)*local_10)(local_10,local_18,1,&local_35);
        if (iVar1 == 0) {
          if (local_35 == 0) {
            local_8 = -2;
          }
          else {
            for (local_36 = 0x80; (local_35 & local_36) == 0;
                local_36 = (byte)((int)(uint)local_36 >> 1)) {
              *local_20 = *local_20 + 1;
            }
            local_8 = 0;
          }
        }
        else {
          local_8 = (long)iVar1;
        }
      }
      else {
        local_8 = local_18;
      }
    }
  }
  return local_8;
}

Assistant:

long long GetUIntLength(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  int status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return E_FILE_FORMAT_INVALID;

  len = 1;

  if (pos >= available)
    return pos;  // too few bytes available

  unsigned char b;

  status = pReader->Read(pos, 1, &b);

  if (status != 0)
    return status;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  return 0;  // success
}